

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_call_setup(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  int iVar1;
  TRef TVar2;
  uint *puVar3;
  long lVar4;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  RecordIndex *unaff_retaddr;
  ptrdiff_t i;
  TRef *fbase;
  TRef kfunc;
  TValue *functv;
  RecordIndex ix;
  TraceError in_stack_ffffffffffffff4c;
  jit_State *in_stack_ffffffffffffff50;
  jit_State *J_00;
  TRef in_stack_ffffffffffffff7c;
  GCfunc *in_stack_ffffffffffffff80;
  jit_State *in_stack_ffffffffffffff88;
  uint local_50;
  long local_48;
  
  puVar3 = (uint *)(*(long *)(in_RDI + 0x88) + (ulong)in_ESI * 4);
  if (*(int *)(*(long *)(in_RDI + 0x88) + (ulong)in_ESI * 4) == 0) {
    sload(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  }
  for (J_00 = (jit_State *)0x1; (long)J_00 <= in_RDX;
      J_00 = (jit_State *)((long)&(J_00->cur).nextgc.gcptr32 + 1)) {
    if (*(int *)(*(long *)(in_RDI + 0x88) + ((long)&(J_00->cur).nextgc.gcptr32 + (ulong)in_ESI) * 4)
        == 0) {
      sload(J_00,in_stack_ffffffffffffff4c);
    }
  }
  local_48 = in_RDX;
  if ((*puVar3 & 0x1f000000) != 0x8000000) {
    iVar1 = lj_record_mm_lookup((jit_State *)i,unaff_retaddr,
                                (MMS)((ulong)*(undefined8 *)(in_RDI + 0x68) >> 0x20));
    if ((iVar1 == 0) || ((local_50 & 0x1f000000) != 0x8000000)) {
      lj_trace_err(J_00,in_stack_ffffffffffffff4c);
    }
    local_48 = in_RDX + 1;
    for (lVar4 = local_48; 0 < lVar4; lVar4 = lVar4 + -1) {
      puVar3[lVar4] = puVar3[lVar4 + -1];
    }
    *puVar3 = local_50;
  }
  TVar2 = rec_call_specialize(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              in_stack_ffffffffffffff7c);
  *puVar3 = TVar2 | 0x10000;
  *(int *)(in_RDI + 0x94) = (int)local_48;
  return;
}

Assistant:

static void rec_call_setup(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  RecordIndex ix;
  TValue *functv = &J->L->base[func];
  TRef kfunc, *fbase = &J->base[func];
  ptrdiff_t i;
  (void)getslot(J, func); /* Ensure func has a reference. */
  for (i = 1; i <= nargs; i++)
    (void)getslot(J, func+LJ_FR2+i);  /* Ensure all args have a reference. */
  if (!tref_isfunc(fbase[0])) {  /* Resolve __call metamethod. */
    ix.tab = fbase[0];
    copyTV(J->L, &ix.tabv, functv);
    if (!lj_record_mm_lookup(J, &ix, MM_call) || !tref_isfunc(ix.mobj))
      lj_trace_err(J, LJ_TRERR_NOMM);
    for (i = ++nargs; i > LJ_FR2; i--)  /* Shift arguments up. */
      fbase[i+LJ_FR2] = fbase[i+LJ_FR2-1];
#if LJ_FR2
    fbase[2] = fbase[0];
#endif
    fbase[0] = ix.mobj;  /* Replace function. */
    functv = &ix.mobjv;
  }
  kfunc = rec_call_specialize(J, funcV(functv), fbase[0]);
#if LJ_FR2
  fbase[0] = kfunc;
  fbase[1] = TREF_FRAME;
#else
  fbase[0] = kfunc | TREF_FRAME;
#endif
  J->maxslot = (BCReg)nargs;
}